

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O1

Cnf_Cut_t * Cnf_CutCreate(Cnf_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  Cnf_Cut_t *pCVar3;
  void *pvVar4;
  
  if (((uint)*(ulong *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                  ,0x5c,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
  }
  uVar2 = *(ulong *)&pObj->field_0x18 >> 0x38;
  if (uVar2 != 0) {
    pvVar4 = (pObj->field_5).pData;
    do {
      if ((~*(uint *)((long)pvVar4 + 4) & 0x18000000) == 0) goto LAB_008efc21;
      pvVar4 = (void *)((long)pvVar4 + 0x18);
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  pvVar4 = (void *)0x0;
LAB_008efc21:
  if (pvVar4 == (void *)0x0) {
    __assert_fail("pCutBest != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                  ,0x5e,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
  }
  uVar1 = *(uint *)((long)pvVar4 + 4);
  if (uVar1 >> 0x1d < 5) {
    pCVar3 = (Cnf_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCuts,(uVar1 >> 0x1d) * 4 + 0x1c);
    pCVar3->nFanins = (byte)(uVar1 >> 0x1d);
    pCVar3->nWords = 1;
    pCVar3->vIsop[0] = (Vec_Int_t *)0x0;
    pCVar3->vIsop[1] = (Vec_Int_t *)0x0;
    memcpy(pCVar3 + 1,(void *)((long)pvVar4 + 8),
           (ulong)(*(uint *)((long)pvVar4 + 4) >> 0x1b & 0xfffffffc));
    *(uint *)((long)pCVar3[1].vIsop + ((ulong)((uVar1 >> 0x1d) << 2) - 8)) =
         CONCAT22(*(undefined2 *)((long)pvVar4 + 4),*(undefined2 *)((long)pvVar4 + 4));
    pCVar3->Cost = p->pSopSizes[(ulong)*(ushort *)((long)pvVar4 + 4) ^ 0xffff] +
                   p->pSopSizes[*(ushort *)((long)pvVar4 + 4)];
    return pCVar3;
  }
  __assert_fail("pCutBest->nLeaves <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                ,0x5f,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
}

Assistant:

Cnf_Cut_t * Cnf_CutCreate( Cnf_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCutBest;
    Cnf_Cut_t * pCut;
    unsigned * pTruth;
    assert( Aig_ObjIsNode(pObj) );
    pCutBest = Dar_ObjBestCut( pObj );
    assert( pCutBest != NULL );
    assert( pCutBest->nLeaves <= 4 );
    pCut = Cnf_CutAlloc( p, pCutBest->nLeaves );
    memcpy( pCut->pFanins, pCutBest->pLeaves, sizeof(int) * pCutBest->nLeaves );
    pTruth = Cnf_CutTruth(pCut);
    *pTruth = (pCutBest->uTruth << 16) | pCutBest->uTruth;
    pCut->Cost = Cnf_CutSopCost( p, pCutBest );
    return pCut;
}